

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O0

void __thiscall
duckdb::TextTreeRenderer::Render(TextTreeRenderer *this,LogicalOperator *op,ostream *ss)

{
  type root;
  LogicalOperator *in_RDI;
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> tree;
  ostream *ss_00;
  TreeRenderer *in_stack_ffffffffffffffd0;
  ostream local_20 [32];
  
  ss_00 = local_20;
  RenderTree::CreateRenderTree(in_RDI);
  root = unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::operator*
                   ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *
                    )ss_00);
  TreeRenderer::ToStream(in_stack_ffffffffffffffd0,root,ss_00);
  unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RenderTree,_std::default_delete<duckdb::RenderTree>,_true> *)
             0x15891a0);
  return;
}

Assistant:

void TextTreeRenderer::Render(const LogicalOperator &op, std::ostream &ss) {
	auto tree = RenderTree::CreateRenderTree(op);
	ToStream(*tree, ss);
}